

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O1

void writeProperty(FILE *fout,string *targetName,string *prop,string *value)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  string local_60;
  string local_40;
  
  pcVar1 = (targetName->_M_dataplus)._M_p;
  cmOutputConverter::EscapeForCMake(&local_60,prop);
  _Var2._M_p = local_60._M_dataplus._M_p;
  cmOutputConverter::EscapeForCMake(&local_40,value);
  fprintf((FILE *)fout,"set_property(TARGET %s PROPERTY %s %s)\n",pcVar1,_Var2._M_p,
          local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void writeProperty(FILE* fout, std::string const& targetName,
                          std::string const& prop, std::string const& value)
{
  fprintf(fout, "set_property(TARGET %s PROPERTY %s %s)\n", targetName.c_str(),
          cmOutputConverter::EscapeForCMake(prop).c_str(),
          cmOutputConverter::EscapeForCMake(value).c_str());
}